

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O3

pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *
genPointPair<float>(pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
                    *__return_storage_ptr__,Matrix<float,_4,_4,_0,_4,_4> *T)

{
  int iVar1;
  int iVar2;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  Matrix<float,_4,_1,_0,_4,_1> Q;
  undefined8 local_58;
  float local_50;
  Matrix<float,_4,_1,_0,_4,_1> local_48;
  Matrix<float,_4,_4,_0,_4,_4> *local_30;
  undefined1 *local_28;
  
  iVar1 = rand();
  iVar2 = rand();
  local_58 = CONCAT44((((float)iVar2 + (float)iVar2) * 4.656613e-10 + -1.0) * 40.0,
                      (((float)iVar1 + (float)iVar1) * 4.656613e-10 + -1.0) * 40.0);
  iVar1 = rand();
  local_50 = (((float)iVar1 + (float)iVar1) * 4.656613e-10 + -1.0) * 40.0;
  local_30 = T;
  local_28 = (undefined1 *)&local_58;
  Eigen::internal::
  homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
  ::evalTo<Eigen::Matrix<float,4,1,0,4,1>>
            ((homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
              *)&local_30,&local_48);
  *(undefined8 *)
   (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
   m_storage.m_data.array = local_58;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] = local_50;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] = 1.0;
  *(undefined8 *)
   (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
   m_storage.m_data.array =
       local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
       _0_8_;
  *(undefined8 *)
   ((__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array + 2) =
       local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
       _8_8_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> genPointPair(Eigen::Matrix<floatPrec,4,4> T){
    
    // get a random 3D point (in homogenous coordinates)
    Eigen::Matrix<floatPrec,3,1> P = Eigen::Matrix<floatPrec, 3, 1>::Random(3) * int(POINTSWITHINCUBE);
    // requires as input the pose between the two 3D scans,
    // to apply the respective transformation to the
    // point in RefB
    
    Eigen::Matrix<floatPrec,4,1> Q = T * P.homogeneous();

    return std::make_pair(P.homogeneous(),Q);
}